

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.c
# Opt level: O2

int elf_zstd_read_fse(uchar **ppin,uchar *pinend,uint16_t *zdebug_table,int maxidx,
                     elf_zstd_fse_entry *table,int *table_bits)

{
  int iVar1;
  ushort uVar2;
  byte *pbVar3;
  int iVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint16_t uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  byte *pbVar15;
  int table_size;
  uint uVar16;
  byte *pbVar17;
  int iVar18;
  ulong uVar19;
  uint *puVar20;
  ulong uVar21;
  bool bVar22;
  
  pbVar3 = *ppin;
  if (pbVar3 + 3 < pinend) {
    uVar7 = -(int)pbVar3 & 3;
    puVar20 = (uint *)(pbVar3 + uVar7);
    uVar13 = 0;
    uVar21 = 0;
    pbVar15 = pbVar3;
    pbVar17 = pbVar3;
    while( true ) {
      if (((ulong)pbVar15 & 3) == 0) break;
      uVar21 = uVar21 | (ulong)*pbVar17 << ((byte)uVar13 & 0x3f);
      uVar13 = uVar13 + 8;
      pbVar17 = pbVar17 + 1;
      pbVar15 = pbVar15 + 1;
    }
    if (uVar13 < 0xf) {
      if ((long)pinend - (long)(pbVar3 + uVar7) < 4) {
        return 0;
      }
      uVar21 = uVar21 | (ulong)*puVar20 << ((byte)uVar13 & 0x3f);
      uVar13 = (ulong)((int)uVar13 + 0x20);
      puVar20 = puVar20 + 1;
    }
    uVar7 = (uint)uVar21 & 0xf;
    iVar1 = uVar7 + 5;
    if (iVar1 <= *table_bits) {
      *table_bits = iVar1;
      uVar21 = uVar21 >> 4;
      uVar12 = (int)uVar13 - 4;
      uVar11 = 0x20 << (sbyte)uVar7;
      uVar16 = uVar11 + 1;
      iVar14 = uVar7 + 6;
      uVar19 = 0;
      bVar22 = false;
      uVar13 = (ulong)uVar11;
      do {
        bVar22 = !bVar22;
        while( true ) {
          iVar18 = (int)uVar19;
          iVar6 = (int)uVar13;
          if ((uVar16 < 2) || (maxidx < iVar18)) {
            if (uVar16 != 1) {
              return 0;
            }
            *ppin = (uchar *)((long)puVar20 - (ulong)(uVar12 >> 3));
            for (uVar13 = (ulong)iVar18; (long)uVar13 <= (long)maxidx; uVar13 = uVar13 + 1) {
              zdebug_table[uVar13] = 0;
            }
            uVar12 = uVar11 - 1;
            uVar19 = 0;
            uVar7 = uVar12;
            uVar21 = uVar13 & 0xffffffff;
            if ((int)uVar13 < 1) {
              uVar21 = uVar19;
            }
            for (; uVar21 != uVar19; uVar19 = uVar19 + 1) {
              uVar9 = zdebug_table[uVar19];
              if ((short)uVar9 < 0) {
                table[(int)uVar7].symbol = (uchar)uVar19;
                uVar7 = uVar7 - 1;
                uVar9 = 1;
              }
              zdebug_table[uVar19 + 0x100] = uVar9;
            }
            uVar16 = 0;
            for (uVar13 = 0; uVar13 != uVar21; uVar13 = uVar13 + 1) {
              uVar8 = 0;
              uVar10 = (uint)zdebug_table[uVar13];
              if ((short)zdebug_table[uVar13] < 1) {
                uVar10 = uVar8;
              }
              for (; uVar8 != uVar10; uVar8 = uVar8 + 1) {
                table[uVar16].symbol = (uchar)uVar13;
                do {
                  uVar16 = uVar16 + (uVar11 >> 3) + (uVar11 >> 1) + 3 & uVar12;
                } while ((int)uVar7 < (int)uVar16);
              }
            }
            if (uVar16 != 0) {
              return 0;
            }
            uVar13 = 0;
            while( true ) {
              if (uVar11 == uVar13) {
                return 1;
              }
              uVar2 = zdebug_table[(ulong)table[uVar13].symbol + 0x100];
              zdebug_table[(ulong)table[uVar13].symbol + 0x100] = uVar2 + 1;
              if (uVar2 == 0) break;
              iVar14 = 0x1f;
              if (uVar2 != 0) {
                for (; uVar2 >> iVar14 == 0; iVar14 = iVar14 + -1) {
                }
              }
              bVar5 = (char)iVar1 - (char)iVar14;
              table[uVar13].bits = bVar5;
              table[uVar13].base = (uVar2 << (bVar5 & 0x1f)) - (short)uVar11;
              uVar13 = uVar13 + 1;
            }
            return 0;
          }
          if (uVar12 < 0xf) {
            if ((long)pinend - (long)puVar20 < 4) {
              return 0;
            }
            uVar21 = uVar21 | (ulong)*puVar20 << ((byte)uVar12 & 0x3f);
            uVar12 = uVar12 | 0x20;
            puVar20 = puVar20 + 1;
          }
          if (bVar22) break;
          uVar19 = uVar19 & 0xffffffff;
          while (uVar7 = uVar12, (~(uint)uVar21 & 0xfff) == 0) {
            uVar19 = (ulong)((int)uVar19 + 0x12);
            uVar21 = uVar21 >> 0xc;
            uVar12 = uVar7 - 0xc;
            if (uVar12 < 0xf) {
              if ((long)pinend - (long)puVar20 < 4) {
                return 0;
              }
              uVar21 = uVar21 | (ulong)*puVar20 << ((byte)uVar12 & 0x3f);
              puVar20 = puVar20 + 1;
              uVar12 = uVar7 + 0x14;
            }
          }
          while( true ) {
            uVar12 = uVar7;
            uVar7 = (uint)uVar21 & 3;
            if (uVar7 != 3) break;
            uVar19 = (ulong)((int)uVar19 + 3);
            uVar21 = uVar21 >> 2;
            uVar7 = uVar12 - 2;
            if (uVar7 < 0xf) {
              if ((long)pinend - (long)puVar20 < 4) {
                return 0;
              }
              uVar21 = uVar21 | (ulong)*puVar20 << ((byte)uVar7 & 0x3f);
              puVar20 = puVar20 + 1;
              uVar7 = uVar12 + 0x1e;
            }
          }
          iVar6 = uVar7 + (int)uVar19;
          if (maxidx < iVar6) {
            return 0;
          }
          uVar21 = uVar21 >> 2;
          uVar12 = uVar12 - 2;
          for (uVar19 = (ulong)iVar18; (long)uVar19 < (long)iVar6; uVar19 = uVar19 + 1) {
            zdebug_table[uVar19] = 0;
          }
          bVar22 = true;
        }
        uVar7 = iVar6 * 2 - 1;
        uVar8 = uVar7 - uVar16;
        uVar10 = iVar6 - 1U & (uint)uVar21;
        if (uVar10 < uVar8) {
          iVar6 = iVar14 + -1;
        }
        else {
          uVar7 = uVar7 & (uint)uVar21;
          if ((int)uVar7 < iVar6) {
            uVar8 = 0;
          }
          uVar10 = uVar7 - uVar8;
          iVar6 = iVar14;
        }
        iVar4 = 1 - uVar10;
        if ((int)uVar10 < 1) {
          iVar4 = -1;
        }
        uVar16 = uVar16 + iVar4;
        zdebug_table[iVar18] = (uint16_t)(uVar10 - 1);
        for (; uVar16 < (uint)uVar13; uVar13 = (ulong)((uint)uVar13 >> 1)) {
          iVar14 = iVar14 + -1;
        }
        bVar22 = uVar10 - 1 == 0;
        uVar12 = uVar12 - iVar6;
        uVar21 = uVar21 >> ((byte)iVar6 & 0x3f);
        uVar19 = (ulong)(iVar18 + 1);
      } while( true );
    }
  }
  return 0;
}

Assistant:

static int
elf_zstd_read_fse (const unsigned char **ppin, const unsigned char *pinend,
		   uint16_t *zdebug_table, int maxidx,
		   struct elf_zstd_fse_entry *table, int *table_bits)
{
  const unsigned char *pin;
  int16_t *norm;
  uint16_t *next;
  uint64_t val;
  unsigned int bits;
  int accuracy_log;
  uint32_t remaining;
  uint32_t threshold;
  int bits_needed;
  int idx;
  int prev0;

  pin = *ppin;

  norm = (int16_t *) zdebug_table;
  next = zdebug_table + 256;

  if (unlikely (pin + 3 >= pinend))
    {
      elf_uncompress_failed ();
      return 0;
    }

  /* Align PIN to a 32-bit boundary.  */

  val = 0;
  bits = 0;
  while ((((uintptr_t) pin) & 3) != 0)
    {
      val |= (uint64_t)*pin << bits;
      bits += 8;
      ++pin;
    }

  if (!elf_fetch_bits (&pin, pinend, &val, &bits))
    return 0;

  accuracy_log = (val & 0xf) + 5;
  if (accuracy_log > *table_bits)
    {
      elf_uncompress_failed ();
      return 0;
    }
  *table_bits = accuracy_log;
  val >>= 4;
  bits -= 4;

  /* This code is mostly copied from the reference implementation.  */

  /* The number of remaining probabilities, plus 1.  This sets the number of
     bits that need to be read for the next value.  */
  remaining = (1 << accuracy_log) + 1;

  /* The current difference between small and large values, which depends on
     the number of remaining values.  Small values use one less bit.  */
  threshold = 1 << accuracy_log;

  /* The number of bits used to compute threshold.  */
  bits_needed = accuracy_log + 1;

  /* The next character value.  */
  idx = 0;

  /* Whether the last count was 0.  */
  prev0 = 0;

  while (remaining > 1 && idx <= maxidx)
    {
      uint32_t max;
      int32_t count;

      if (!elf_fetch_bits (&pin, pinend, &val, &bits))
	return 0;

      if (prev0)
	{
	  int zidx;

	  /* Previous count was 0, so there is a 2-bit repeat flag.  If the
	     2-bit flag is 0b11, it adds 3 and then there is another repeat
	     flag.  */
	  zidx = idx;
	  while ((val & 0xfff) == 0xfff)
	    {
	      zidx += 3 * 6;
	      val >>= 12;
	      bits -= 12;
	      if  (!elf_fetch_bits (&pin, pinend, &val, &bits))
		return 0;
	    }
	  while ((val & 3) == 3)
	    {
	      zidx += 3;
	      val >>= 2;
	      bits -= 2;
	      if (!elf_fetch_bits (&pin, pinend, &val, &bits))
		return 0;
	    }
	  /* We have at least 13 bits here, don't need to fetch.  */
	  zidx += val & 3;
	  val >>= 2;
	  bits -= 2;

	  if (unlikely (zidx > maxidx))
	    {
	      elf_uncompress_failed ();
	      return 0;
	    }

	  for (; idx < zidx; idx++)
	    norm[idx] = 0;

	  prev0 = 0;
	  continue;
	}

      max = (2 * threshold - 1) - remaining;
      if ((val & (threshold - 1)) < max)
	{
	  /* A small value.  */
	  count = (int32_t) ((uint32_t) val & (threshold - 1));
	  val >>= bits_needed - 1;
	  bits -= bits_needed - 1;
	}
      else
	{
	  /* A large value.  */
	  count = (int32_t) ((uint32_t) val & (2 * threshold - 1));
	  if (count >= (int32_t) threshold)
	    count -= (int32_t) max;
	  val >>= bits_needed;
	  bits -= bits_needed;
	}

      count--;
      if (count >= 0)
	remaining -= count;
      else
	remaining--;
      if (unlikely (idx >= 256))
	{
	  elf_uncompress_failed ();
	  return 0;
	}
      norm[idx] = (int16_t) count;
      ++idx;

      prev0 = count == 0;

      while (remaining < threshold)
	{
	  bits_needed--;
	  threshold >>= 1;
	}
    }

  if (unlikely (remaining != 1))
    {
      elf_uncompress_failed ();
      return 0;
    }

  /* If we've read ahead more than a byte, back up.  */
  while (bits >= 8)
    {
      --pin;
      bits -= 8;
    }

  *ppin = pin;

  for (; idx <= maxidx; idx++)
    norm[idx] = 0;

  return elf_zstd_build_fse (norm, idx, next, *table_bits, table);
}